

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

JavascriptProxy * Js::JavascriptProxy::Create(ScriptContext *scriptContext,Arguments *args)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Var pvVar5;
  Recycler *pRVar6;
  JavascriptProxy *pJVar7;
  JavascriptLibrary *this;
  DynamicType *pDVar8;
  RecyclableObject *pRVar9;
  JavascriptProxy *local_f0;
  TrackAllocData local_b0;
  JavascriptProxy *local_88;
  JavascriptProxy *newProxy;
  RecyclableObject *handler;
  RecyclableObject *target;
  byte local_59;
  Var pvStack_58;
  bool isCtorSuperCall;
  Var newTarget;
  Arguments *args_local;
  ScriptContext *scriptContext_local;
  TypeId local_34;
  Var local_30;
  TypeId local_28;
  TypeId local_24;
  RecyclableObject *pRStack_20;
  TypeId typeId;
  TypeId local_14;
  RecyclableObject *pRStack_10;
  TypeId typeId_1;
  
  newTarget = args;
  args_local = (Arguments *)scriptContext;
  pvStack_58 = Arguments::GetNewTarget(args);
  Arguments::Arguments((Arguments *)&target,args);
  local_59 = Js::JavascriptOperators::IsConstructorSuperCall((Arguments *)&target);
  if ((SUB84(args->Info,0) & 0xffffff) < 3) {
    JavascriptError::ThrowTypeError((ScriptContext *)args_local,-0x7ff5ea18,(PCWSTR)0x0);
  }
  local_30 = Arguments::operator[](args,1);
  if (local_30 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(local_30);
  if (bVar2) {
    local_28 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(local_30);
    if (bVar2) {
      local_28 = TypeIds_Number;
    }
    else {
      pRStack_20 = UnsafeVarTo<Js::RecyclableObject>(local_30);
      if (pRStack_20 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      local_24 = RecyclableObject::GetTypeId(pRStack_20);
      if ((0x57 < (int)local_24) && (BVar3 = RecyclableObject::IsExternal(pRStack_20), BVar3 == 0))
      {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      local_28 = local_24;
    }
  }
  BVar3 = Js::JavascriptOperators::IsObjectType(local_28);
  if (BVar3 == 0) {
    JavascriptError::ThrowTypeError((ScriptContext *)args_local,-0x7ff5ea17,L"target");
  }
  pvVar5 = Arguments::operator[](args,1);
  handler = &VarTo<Js::DynamicObject>(pvVar5)->super_RecyclableObject;
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(handler);
  bVar2 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(handler);
  if (bVar2) {
    pJVar7 = UnsafeVarTo<Js::JavascriptProxy,Js::RecyclableObject>(handler);
    bVar2 = IsRevoked(pJVar7);
    if (bVar2) {
      JavascriptError::ThrowTypeError((ScriptContext *)args_local,-0x7ff5ea17,L"target");
    }
  }
  scriptContext_local = (ScriptContext *)Arguments::operator[](args,2);
  if (scriptContext_local == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(scriptContext_local);
  if (bVar2) {
    local_34 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(scriptContext_local);
    if (bVar2) {
      local_34 = TypeIds_Number;
    }
    else {
      pRStack_10 = UnsafeVarTo<Js::RecyclableObject>(scriptContext_local);
      if (pRStack_10 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      local_14 = RecyclableObject::GetTypeId(pRStack_10);
      if ((0x57 < (int)local_14) && (BVar3 = RecyclableObject::IsExternal(pRStack_10), BVar3 == 0))
      {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      local_34 = local_14;
    }
  }
  BVar3 = Js::JavascriptOperators::IsObjectType(local_34);
  if (BVar3 != 0) {
    pvVar5 = Arguments::operator[](args,2);
    newProxy = (JavascriptProxy *)VarTo<Js::DynamicObject>(pvVar5);
    bVar2 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>((RecyclableObject *)newProxy);
    if (bVar2) {
      pJVar7 = UnsafeVarTo<Js::JavascriptProxy,Js::RecyclableObject>((RecyclableObject *)newProxy);
      bVar2 = IsRevoked(pJVar7);
      if (bVar2) {
        JavascriptError::ThrowTypeError((ScriptContext *)args_local,-0x7ff5ea17,L"handler");
      }
    }
    pRVar6 = ScriptContext::GetRecycler((ScriptContext *)args_local);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_b0,(type_info *)&typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
               ,0x66);
    pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_b0);
    pJVar7 = (JavascriptProxy *)new<Memory::Recycler>(0x30,pRVar6,0x43c4b0);
    this = ScriptContext::GetLibrary((ScriptContext *)args_local);
    pDVar8 = JavascriptLibrary::GetProxyType(this);
    JavascriptProxy(pJVar7,pDVar8,(ScriptContext *)args_local,handler,(RecyclableObject *)newProxy);
    local_88 = pJVar7;
    bVar2 = JavascriptConversion::IsCallable(handler);
    if (bVar2) {
      DynamicObject::ChangeType(&local_88->super_DynamicObject);
      pDVar8 = DynamicObject::GetDynamicType(&local_88->super_DynamicObject);
      DynamicType::SetEntryPoint(pDVar8,FunctionCallTrap);
    }
    if ((local_59 & 1) == 0) {
      local_f0 = local_88;
    }
    else {
      pRVar9 = VarTo<Js::RecyclableObject>(pvStack_58);
      pRVar9 = Js::JavascriptOperators::OrdinaryCreateFromConstructor
                         (pRVar9,(RecyclableObject *)local_88,(DynamicObject *)0x0,
                          (ScriptContext *)args_local);
      local_f0 = VarTo<Js::JavascriptProxy,Js::RecyclableObject>(pRVar9);
    }
    return local_f0;
  }
  JavascriptError::ThrowTypeError((ScriptContext *)args_local,-0x7ff5ea17,L"handler");
}

Assistant:

JavascriptProxy* JavascriptProxy::Create(ScriptContext* scriptContext, Arguments args)
    {
        // SkipDefaultNewObject function flag should have prevented the default object from
        // being created, except when call true a host dispatch.

        Var newTarget = args.GetNewTarget();
        bool isCtorSuperCall = JavascriptOperators::IsConstructorSuperCall(args);

        RecyclableObject* target, *handler;

        if (args.Info.Count < 3)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedProxyArgument);
        }

        if (!JavascriptOperators::IsObjectType(JavascriptOperators::GetTypeId(args[1])))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_InvalidProxyArgument, _u("target"));
        }
        target = VarTo<DynamicObject>(args[1]);
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(target);
#endif
        if (VarIs<JavascriptProxy>(target))
        {
            if (UnsafeVarTo<JavascriptProxy>(target)->IsRevoked())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_InvalidProxyArgument, _u("target"));
            }
        }

        if (!JavascriptOperators::IsObjectType(JavascriptOperators::GetTypeId(args[2])))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_InvalidProxyArgument, _u("handler"));
        }
        handler = VarTo<DynamicObject>(args[2]);
        if (VarIs<JavascriptProxy>(handler))
        {
            if (UnsafeVarTo<JavascriptProxy>(handler)->IsRevoked())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_InvalidProxyArgument, _u("handler"));
            }
        }

        JavascriptProxy* newProxy = RecyclerNew(scriptContext->GetRecycler(), JavascriptProxy, scriptContext->GetLibrary()->GetProxyType(), scriptContext, target, handler);
        if (JavascriptConversion::IsCallable(target))
        {
            newProxy->ChangeType();
            newProxy->GetDynamicType()->SetEntryPoint(JavascriptProxy::FunctionCallTrap);
        }
        return isCtorSuperCall ?
            VarTo<JavascriptProxy>(JavascriptOperators::OrdinaryCreateFromConstructor(VarTo<RecyclableObject>(newTarget), newProxy, nullptr, scriptContext)) :
            newProxy;
    }